

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void handle_constant_dollar_field(List *ls,int constant,int field_length)

{
  undefined4 uVar1;
  byte bVar2;
  Token *pTVar4;
  TokenType TVar5;
  Token copy_of_t;
  Token *t;
  int field_length_local;
  int constant_local;
  List *ls_local;
  uint uVar3;
  
  pTVar4 = &ls->token;
  uVar1 = *(undefined4 *)&(ls->token).u;
  if (pTVar4->type - TOK_DOLLAR_DATA_REGISTER < 6) {
    copy_of_t.type._0_1_ = (undefined1)uVar1;
    copy_of_t.type._1_1_ = (undefined1)((uint)uVar1 >> 8);
    bVar2 = (byte)constant;
    uVar3 = constant >> 3;
    switch(pTVar4->type) {
    case TOK_DOLLAR_DATA_REGISTER:
      pTVar4->type = TOK_DATA_REGISTER;
      (ls->token).u.reginfo.which = bVar2;
      (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
      (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      break;
    case TOK_DOLLAR_ADDRESS_REGISTER:
      pTVar4->type = TOK_ADDRESS_REGISTER;
      (ls->token).u.reginfo.which = bVar2;
      (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
      (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      break;
    case TOK_DOLLAR_GENERAL_REGISTER:
      TVar5 = TOK_DATA_REGISTER;
      if (7 < constant) {
        TVar5 = TOK_ADDRESS_REGISTER;
      }
      pTVar4->type = TVar5;
      (ls->token).u.reginfo.which = (uchar)(constant % 8);
      (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
      (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      break;
    case TOK_DOLLAR_AMODE:
      if ((uVar3 & 7) == 0) {
        pTVar4->type = TOK_DATA_REGISTER;
        (ls->token).u.reginfo.which = bVar2 & 7;
        (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
        (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      }
      else if ((uVar3 & 7) == 1) {
        pTVar4->type = TOK_ADDRESS_REGISTER;
        (ls->token).u.reginfo.which = bVar2 & 7;
        (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
        (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      }
      else {
        pTVar4->type = TOK_AMODE;
        (ls->token).u.reginfo.which = bVar2;
        (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
        (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      }
      break;
    case TOK_DOLLAR_REVERSED_AMODE:
      if ((constant & 7U) == 0) {
        pTVar4->type = TOK_DATA_REGISTER;
        (ls->token).u.reginfo.which = bVar2 & 7;
        (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
        (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      }
      else if ((constant & 7U) == 1) {
        pTVar4->type = TOK_ADDRESS_REGISTER;
        (ls->token).u.reginfo.which = bVar2 & 7;
        (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
        (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      }
      else {
        pTVar4->type = TOK_REVERSED_AMODE;
        (ls->token).u.reginfo.which = (byte)((constant & 7U) << 3) | (byte)uVar3 & 7;
        (ls->token).u.reginfo.sgnd = (undefined1)copy_of_t.type;
        (ls->token).u.reginfo.size = copy_of_t.type._1_1_;
      }
      break;
    case TOK_DOLLAR_NUMBER:
      pTVar4->type = TOK_NUMBER;
      t._4_4_ = constant;
      if (((ls->token).u.reginfo.sgnd != '\0') &&
         (((long)constant & 1L << ((byte)field_length - 1 & 0x3f)) != 0)) {
        t._4_4_ = constant | (int)(1L << ((byte)field_length & 0x3f)) - 1U ^ 0xffffffff;
      }
      (ls->token).u = (anon_union_8_7_0ba269be_for_u)(long)(int)t._4_4_;
    }
  }
  else {
    fatal_error("Internal error: generate_code.c: IS_DOLLAR_TOKEN() must be bad.\n");
  }
  return;
}

Assistant:

static void
handle_constant_dollar_field (List *ls, int constant, int field_length)
{
  Token *t = &ls->token;
  Token copy_of_t = *t;
  
  /* Switch on what type of argument this is. */
  switch (t->type) {
    
    /* Data register. */
  case TOK_DOLLAR_DATA_REGISTER:
    t->type            = TOK_DATA_REGISTER;
    t->u.reginfo.which = constant;
    t->u.reginfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
    t->u.reginfo.size  = copy_of_t.u.dollarinfo.size;
    break;
    
    /* Address register. */
  case TOK_DOLLAR_ADDRESS_REGISTER:
    t->type            = TOK_ADDRESS_REGISTER;
    t->u.reginfo.which = constant;
    t->u.reginfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
    t->u.reginfo.size  = copy_of_t.u.dollarinfo.size;
    break;

    /* General register. */
  case TOK_DOLLAR_GENERAL_REGISTER:
    t->type = (constant >= 8 ? TOK_ADDRESS_REGISTER : TOK_DATA_REGISTER);
    t->u.reginfo.which = constant % 8;
    t->u.reginfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
    t->u.reginfo.size  = copy_of_t.u.dollarinfo.size;
    break;

  case TOK_DOLLAR_AMODE:
    if (((constant >> 3) & 7) == 0)
      {
	t->type = TOK_DATA_REGISTER;
	t->u.reginfo.which = constant & 7;
	t->u.reginfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
	t->u.reginfo.size  = copy_of_t.u.dollarinfo.size;
      }
    else if (((constant >> 3) & 7) == 1)
      {
	t->type = TOK_ADDRESS_REGISTER;
	t->u.reginfo.which = constant & 7;
	t->u.reginfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
	t->u.reginfo.size  = copy_of_t.u.dollarinfo.size;
      }
    else
      {
	t->type = TOK_AMODE;
	t->u.amodeinfo.which = constant;
	t->u.amodeinfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
	t->u.amodeinfo.size  = copy_of_t.u.dollarinfo.size;
      }
    break;

  case TOK_DOLLAR_REVERSED_AMODE:
    if ((constant & 7) == 0)
      {
	t->type = TOK_DATA_REGISTER;
	t->u.reginfo.which = constant & 7;
	t->u.reginfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
	t->u.reginfo.size  = copy_of_t.u.dollarinfo.size;
      }
    else if ((constant & 7) == 1)
      {
	t->type = TOK_ADDRESS_REGISTER;
	t->u.reginfo.which = constant & 7;
	t->u.reginfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
	t->u.reginfo.size  = copy_of_t.u.dollarinfo.size;
      }
    else
      {
	t->type = TOK_REVERSED_AMODE;  /* We swap the bits here anyway. */
	t->u.amodeinfo.which = ((constant & 7) << 3) | ((constant >> 3) & 7);
	t->u.amodeinfo.sgnd  = copy_of_t.u.dollarinfo.sgnd;
	t->u.amodeinfo.size  = copy_of_t.u.dollarinfo.size;
      }
    break;

  case TOK_DOLLAR_NUMBER:
    t->type = TOK_NUMBER;

    /* Sign extend if we have to.  Assumes 2's complement machine. */
    if (t->u.dollarinfo.sgnd && (constant & (1L << (field_length - 1))))
      constant |= ~((1L << field_length) - 1);

    /* Save the new, sign extended number. */
    t->u.n = constant;
    break;
  default:
    fatal_error ("Internal error: generate_code.c: IS_DOLLAR_TOKEN() "
		 "must be bad.\n");
    break;
  }
}